

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dir.cpp
# Opt level: O0

void __thiscall
just_test_test_case_test_non_empty_directory_is_deleted::
just_test_test_case_test_non_empty_directory_is_deleted
          (just_test_test_case_test_non_empty_directory_is_deleted *this)

{
  test_manager *this_00;
  allocator<char> local_31;
  string local_30;
  just_test_test_case_test_non_empty_directory_is_deleted *local_10;
  just_test_test_case_test_non_empty_directory_is_deleted *this_local;
  
  local_10 = this;
  this_00 = just::test::singleton<just::test::test_manager>::get();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"test_non_empty_directory_is_deleted",&local_31);
  just::test::test_manager::add
            (this_00,&local_30,just_test_test_case_f_test_non_empty_directory_is_deleted);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

JUST_TEST_CASE(test_non_empty_directory_is_deleted)
{
  std::string p;
  {
    const temp::directory d;
    p = d.path();
    const std::string fp = p + "/test.txt";
    std::ofstream f(fp.c_str());
  }

  JUST_ASSERT(!dir_exists(p));
}